

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::RE2(RE2 *this,StringPiece *pattern)

{
  string *in_RDI;
  Options *in_stack_00000470;
  StringPiece *in_stack_00000478;
  RE2 *in_stack_00000480;
  Options local_38 [2];
  
  std::__cxx11::string::string(in_RDI);
  Options::Options((Options *)(in_RDI + 0x20));
  std::__cxx11::string::string(in_RDI + 0x38);
  std::__cxx11::string::string(in_RDI + 0x98);
  std::once_flag::once_flag((once_flag *)(in_RDI + 200));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0xcc));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0xd0));
  Options::Options(local_38,DefaultOptions);
  Init(in_stack_00000480,in_stack_00000478,in_stack_00000470);
  return;
}

Assistant:

RE2::RE2(const StringPiece& pattern) {
  Init(pattern, DefaultOptions);
}